

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O2

void __thiscall crypto::xchacha20::discard(xchacha20 *this,size_t length)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = this->pos;
  if ((ulong)bVar1 != 0x40) {
    uVar2 = 0x40 - (ulong)bVar1;
    if (length <= uVar2) {
      uVar2 = length;
    }
    this->pos = bVar1 + (char)uVar2;
    length = length - uVar2;
  }
  *(size_t *)(this->state + 0xc) = *(long *)(this->state + 0xc) + (length >> 6);
  if ((length & 0x3f) != 0) {
    update(this);
    this->pos = (byte)length & 0x3f;
  }
  return;
}

Assistant:

void xchacha20::discard(size_t length) {
	
	// asume pos > 0 && pos <= sizeof(keystream)
	
	if(pos != sizeof(keystream)) {
		size_t remaining = std::min(length, size_t(64) - size_t(pos));
		pos = boost::uint8_t(pos + remaining);
		length -= remaining;
	}
	
	// assert length == 0 || pos == sizeof(keystream)
	
	increment_count(state, length / sizeof(keystream));
	
	if(length % sizeof(keystream)) {
		update();
		pos = boost::uint8_t(length % sizeof(keystream));
	}
	
}